

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd.c
# Opt level: O0

int trbudget_check(trbudget_t *budget,int size)

{
  int size_local;
  trbudget_t *budget_local;
  int local_4;
  
  if (budget->remain < size) {
    if (budget->chance == 0) {
      budget->count = size + budget->count;
      local_4 = 0;
    }
    else {
      budget->remain = (budget->incval - size) + budget->remain;
      budget->chance = budget->chance + -1;
      local_4 = 1;
    }
  }
  else {
    budget->remain = budget->remain - size;
    local_4 = 1;
  }
  return local_4;
}

Assistant:

static INLINE
int
trbudget_check(trbudget_t *budget, int size) {
  if(size <= budget->remain) { budget->remain -= size; return 1; }
  if(budget->chance == 0) { budget->count += size; return 0; }
  budget->remain += budget->incval - size;
  budget->chance -= 1;
  return 1;
}